

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

SmallVectorImpl<int> * __thiscall
tf::SmallVectorImpl<int>::operator=(SmallVectorImpl<int> *this,SmallVectorImpl<int> *RHS)

{
  void *pvVar1;
  void *pvVar2;
  size_t __n;
  void *pvVar3;
  void *__dest;
  long lVar4;
  ulong __n_00;
  
  if (this == RHS) {
    return this;
  }
  pvVar1 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  pvVar3 = (RHS->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  __n_00 = (long)pvVar3 - (long)pvVar1;
  __dest = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
  pvVar2 = (this->super_SmallVectorTemplateBase<int,_true>).
           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
  __n = (long)pvVar2 - (long)__dest;
  if (__n < __n_00) {
    if ((ulong)((long)(this->super_SmallVectorTemplateBase<int,_true>).
                      super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.CapacityX -
               (long)__dest) < __n_00) {
      (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
      super_SmallVectorBase.EndX = __dest;
      SmallVectorBase::grow_pod
                ((SmallVectorBase *)this,
                 &(this->super_SmallVectorTemplateBase<int,_true>).
                  super_SmallVectorTemplateCommon<int,_void>.FirstEl,__n_00,4);
LAB_00136737:
      lVar4 = 0;
    }
    else {
      if (pvVar2 == __dest) goto LAB_00136737;
      lVar4 = (long)__n >> 2;
      memmove(__dest,pvVar1,__n);
    }
    pvVar3 = (void *)(lVar4 * 4 +
                     (long)(RHS->super_SmallVectorTemplateBase<int,_true>).
                           super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX);
    pvVar1 = (RHS->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.EndX;
    __dest = (this->super_SmallVectorTemplateBase<int,_true>).
             super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    if (pvVar3 != pvVar1) {
      memcpy((void *)((long)__dest + lVar4 * 4),pvVar3,(long)pvVar1 - (long)pvVar3);
      __dest = (this->super_SmallVectorTemplateBase<int,_true>).
               super_SmallVectorTemplateCommon<int,_void>.super_SmallVectorBase.BeginX;
    }
  }
  else {
    if (pvVar3 == pvVar1) goto LAB_00136763;
    memmove(__dest,pvVar1,__n_00);
  }
  __dest = (void *)((long)__dest + __n_00);
LAB_00136763:
  (this->super_SmallVectorTemplateBase<int,_true>).super_SmallVectorTemplateCommon<int,_void>.
  super_SmallVectorBase.EndX = __dest;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}